

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

void proto3_unittest::ForeignMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int32_t iVar2;
  ForeignMessage **v1;
  ForeignMessage **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  uint32_t *puVar4;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  ForeignMessage *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ForeignMessage *from;
  ForeignMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (ForeignMessage *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (ForeignMessage *)to_msg;
  _this = (ForeignMessage *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto3_unittest::ForeignMessage_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto3_unittest::ForeignMessage*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto3_unittest::ForeignMessage_const*,proto3_unittest::ForeignMessage*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    uVar1 = *puVar4;
    if (((uVar1 & 1) != 0) &&
       (iVar2 = _internal_c((ForeignMessage *)absl_log_internal_check_op_result), iVar2 != 0)) {
      (from->field_0)._impl_.c_ = *(int32_t *)(absl_log_internal_check_op_result + 0x18);
    }
    puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar4 = uVar1 | *puVar4;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3.pb.cc"
             ,0x1371,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void ForeignMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ForeignMessage*>(&to_msg);
  auto& from = static_cast<const ForeignMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_unittest.ForeignMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (from._internal_c() != 0) {
      _this->_impl_.c_ = from._impl_.c_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}